

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion_facade.c
# Opt level: O0

void av1_compute_global_motion_facade(AV1_COMP *cpi)

{
  long *in_RDI;
  AV1_COMP *unaff_retaddr;
  int i;
  GlobalMotionInfo *gm_info;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  GlobalMotionData *gm_data;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x77f0);
  gm_data = (GlobalMotionData *)(in_RDI + 0xc0c8);
  if (((*(byte *)((long)in_RDI + 0x4244b) & 1) != 0) && ((char)in_RDI[0xe258] == '\0')) {
    for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 7;
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
      *(undefined4 *)(*in_RDI + 0x14d4c + (long)in_stack_ffffffffffffffe4 * 4) = 0x7fffffff;
    }
  }
  if (((((char)in_RDI[0x77f0] == '\x01') && (in_RDI[0x84f5] != 0)) &&
      ((*(byte *)((long)in_RDI + 0x4244b) & 1) != 0)) &&
     (((((ulong)gm_data->motion_models[0].params[0] & 1) == 0 && ((char)in_RDI[0xc126] != '\x04'))
      && ((setup_global_motion_info_params(cpi_00), (int)in_RDI[0xc0d1] != 0 ||
          (*(int *)((long)in_RDI + 0x6068c) != 0)))))) {
    gm_alloc_data(cpi_00,gm_data);
    if ((int)in_RDI[0x135c9] < 2) {
      global_motion_estimation(unaff_retaddr);
    }
    else {
      av1_global_motion_estimation_mt
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    gm_dealloc_data((GlobalMotionData *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(undefined1 *)gm_data->motion_models[0].params = 1;
  }
  memcpy((void *)(*(long *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xd] + 4) + 0x114),
         (cpi_00->enc_quant_dequant_params).quants.u_quant_fp[0xf5] + 2,0x120);
  return;
}

Assistant:

void av1_compute_global_motion_facade(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  GlobalMotionInfo *const gm_info = &cpi->gm_info;

  if (cpi->oxcf.tool_cfg.enable_global_motion) {
    if (cpi->gf_frame_index == 0) {
      for (int i = 0; i < FRAME_UPDATE_TYPES; i++) {
        cpi->ppi->valid_gm_model_found[i] = INT32_MAX;
#if CONFIG_FPMT_TEST
        if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
          cpi->ppi->temp_valid_gm_model_found[i] = INT32_MAX;
#endif
      }
    }
  }

  if (cpi->common.current_frame.frame_type == INTER_FRAME && cpi->source &&
      cpi->oxcf.tool_cfg.enable_global_motion && !gm_info->search_done &&
      cpi->sf.gm_sf.gm_search_type != GM_DISABLE_SEARCH) {
    setup_global_motion_info_params(cpi);
    // Terminate early if the total number of reference frames is zero.
    if (cpi->gm_info.num_ref_frames[0] || cpi->gm_info.num_ref_frames[1]) {
      gm_alloc_data(cpi, &cpi->td.gm_data);
      if (cpi->mt_info.num_workers > 1)
        av1_global_motion_estimation_mt(cpi);
      else
        global_motion_estimation(cpi);
      gm_dealloc_data(&cpi->td.gm_data);
      gm_info->search_done = 1;
    }
  }
  memcpy(cm->cur_frame->global_motion, cm->global_motion,
         sizeof(cm->cur_frame->global_motion));
}